

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_dependencyByIndex_Test::AnalyserExternalVariable_dependencyByIndex_Test
          (AnalyserExternalVariable_dependencyByIndex_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001507c8;
  return;
}

Assistant:

TEST(AnalyserExternalVariable, dependencyByIndex)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    EXPECT_EQ(nullptr, externalVariable->dependency(0));

    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_EQ(dependency, externalVariable->dependency(0));
    EXPECT_EQ(nullptr, externalVariable->dependency(1));
}